

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav_read_pcm_frames(ma_dr_wav *pWav,ma_uint64 framesToRead,void *pBufferOut)

{
  ma_dr_wav_container mVar1;
  void *in_RDX;
  void *in_RSI;
  ma_dr_wav *in_RDI;
  ma_uint64 iSample;
  ma_uint64 framesRead;
  ulong local_30;
  ma_uint64 local_28;
  int iVar2;
  
  mVar1 = in_RDI->container;
  if ((mVar1 == ma_dr_wav_container_rifx) || (mVar1 == ma_dr_wav_container_aiff)) {
    iVar2 = 1;
  }
  else {
    iVar2 = 0;
  }
  if ((iVar2 == 0) ||
     ((in_RDI->container == ma_dr_wav_container_aiff && ((in_RDI->aiff).isLE != '\0')))) {
    local_28 = ma_dr_wav_read_pcm_frames_le(in_RDI,(ma_uint64)in_RSI,in_RDX);
  }
  else {
    local_28 = ma_dr_wav_read_pcm_frames_be
                         ((ma_dr_wav *)CONCAT44(iVar2,mVar1),(ma_uint64)in_RDI,in_RSI);
  }
  if ((((in_RDI->container == ma_dr_wav_container_aiff) && (in_RDI->bitsPerSample == 8)) &&
      ((in_RDI->aiff).isUnsigned == '\0')) && (in_RDX != (void *)0x0)) {
    for (local_30 = 0; local_30 < local_28 * in_RDI->channels; local_30 = local_30 + 1) {
      *(char *)((long)in_RDX + local_30) = *(char *)((long)in_RDX + local_30) + -0x80;
    }
  }
  return local_28;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames(ma_dr_wav* pWav, ma_uint64 framesToRead, void* pBufferOut)
{
    ma_uint64 framesRead = 0;
    if (ma_dr_wav_is_container_be(pWav->container)) {
        if (pWav->container != ma_dr_wav_container_aiff || pWav->aiff.isLE == MA_FALSE) {
            if (ma_dr_wav__is_little_endian()) {
                framesRead = ma_dr_wav_read_pcm_frames_be(pWav, framesToRead, pBufferOut);
            } else {
                framesRead = ma_dr_wav_read_pcm_frames_le(pWav, framesToRead, pBufferOut);
            }
            goto post_process;
        }
    }
    if (ma_dr_wav__is_little_endian()) {
        framesRead = ma_dr_wav_read_pcm_frames_le(pWav, framesToRead, pBufferOut);
    } else {
        framesRead = ma_dr_wav_read_pcm_frames_be(pWav, framesToRead, pBufferOut);
    }
    post_process:
    {
        if (pWav->container == ma_dr_wav_container_aiff && pWav->bitsPerSample == 8 && pWav->aiff.isUnsigned == MA_FALSE) {
            if (pBufferOut != NULL) {
                ma_uint64 iSample;
                for (iSample = 0; iSample < framesRead * pWav->channels; iSample += 1) {
                    ((ma_uint8*)pBufferOut)[iSample] += 128;
                }
            }
        }
    }
    return framesRead;
}